

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

string * __thiscall
QPDFObject::getStringValue_abi_cxx11_(string *__return_storage_ptr__,QPDFObject *this)

{
  qpdf_object_type_e qVar1;
  string *psVar2;
  __shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  logic_error *this_02;
  QPDFObject *this_local;
  
  qVar1 = getResolvedTypeCode(this);
  switch(qVar1) {
  case ot_real:
    psVar2 = (string *)
             std::
             get<QPDF_Real,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&this->value);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
    break;
  case ot_string:
    psVar2 = (string *)
             std::
             get<QPDF_String,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&this->value);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
    break;
  case ot_name:
    psVar2 = (string *)
             std::
             get<QPDF_Name,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&this->value);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
    break;
  default:
    this_02 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_02,"Internal error in QPDFObject::getStringValue");
    __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case ot_operator:
    psVar2 = (string *)
             std::
             get<QPDF_Operator,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&this->value);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
    break;
  case ot_inlineimage:
    psVar2 = (string *)
             std::
             get<QPDF_InlineImage,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&this->value);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
    break;
  case ot_reference:
    this_00 = (__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              get<QPDF_Reference,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&this->value);
    this_01 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    getStringValue_abi_cxx11_(__return_storage_ptr__,this_01);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObject::getStringValue() const
{
    switch (getResolvedTypeCode()) {
    case ::ot_real:
        return std::get<QPDF_Real>(value).val;
    case ::ot_string:
        return std::get<QPDF_String>(value).val;
    case ::ot_name:
        return std::get<QPDF_Name>(value).name;
    case ::ot_operator:
        return std::get<QPDF_Operator>(value).val;
    case ::ot_inlineimage:
        return std::get<QPDF_InlineImage>(value).val;
    case ::ot_reference:
        return std::get<QPDF_Reference>(value).obj->getStringValue();
    default:
        throw std::logic_error("Internal error in QPDFObject::getStringValue");
    }
    return ""; // unreachable
}